

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O3

void __thiscall
particleSamples::perform_weak_resonance_feed_down_Sigma_to_Lambda(particleSamples *this)

{
  int iVar1;
  vector<particle_info,std::allocator<particle_info>> *this_00;
  undefined4 uVar2;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *pvVar3;
  int iVar4;
  long lVar5;
  pointer ppvVar6;
  pointer paVar7;
  particle_info *ppVar8;
  iterator __position;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  byte bVar13;
  particle_info daughter2;
  particle_info daughter1;
  particle_info local_120;
  particle_info local_a8;
  
  bVar13 = 0;
  iVar1 = this->particle_monval;
  iVar4 = -iVar1;
  if (0 < iVar1) {
    iVar4 = iVar1;
  }
  if (iVar4 == 0xc32) {
    pvVar3 = this->resonance_list_Sigma0;
    ppvVar6 = (pvVar3->
              super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((pvVar3->
        super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
        )._M_impl.super__Vector_impl_data._M_finish != ppvVar6) {
      uVar10 = 0;
      do {
        paVar7 = (ppvVar6[uVar10]->super__Vector_base<particle_info,_std::allocator<particle_info>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ppvVar6[uVar10]->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
            _M_impl.super__Vector_impl_data._M_finish != paVar7) {
          uVar9 = 0;
          uVar11 = 1;
          do {
            local_a8.mass = 1.116;
            local_120.mass = 0.0;
            particle_decay::perform_two_body_decay
                      (this->decayer_ptr,paVar7 + uVar9,&local_a8,&local_120);
            this_00 = (vector<particle_info,std::allocator<particle_info>> *)
                      (this->particle_list->
                      super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar10];
            __position._M_current = *(anon_struct_120_15_f999644b **)(this_00 + 8);
            if (__position._M_current == *(anon_struct_120_15_f999644b **)(this_00 + 0x10)) {
              std::vector<particle_info,std::allocator<particle_info>>::
              _M_realloc_insert<particle_info_const&>(this_00,__position,&local_a8);
            }
            else {
              ppVar8 = &local_a8;
              for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
                uVar2 = *(undefined4 *)&ppVar8->field_0x4;
                (__position._M_current)->monval = ppVar8->monval;
                *(undefined4 *)&(__position._M_current)->field_0x4 = uVar2;
                ppVar8 = (particle_info *)((long)ppVar8 + (ulong)bVar13 * -0x10 + 8);
                __position._M_current = __position._M_current + (ulong)bVar13 * -0x10 + 8;
              }
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x78;
            }
            pvVar3 = this->resonance_list_Sigma0;
            ppvVar6 = (pvVar3->
                      super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            paVar7 = (ppvVar6[uVar10]->
                     super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar9 = ((long)(ppvVar6[uVar10]->
                           super__Vector_base<particle_info,_std::allocator<particle_info>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)paVar7 >> 3) *
                    -0x1111111111111111;
            bVar12 = uVar11 <= uVar9;
            lVar5 = uVar9 - uVar11;
            uVar9 = uVar11;
            uVar11 = (ulong)((int)uVar11 + 1);
          } while (bVar12 && lVar5 != 0);
        }
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (uVar10 < (ulong)((long)(pvVar3->
                                      super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar6 >>
                               3));
    }
  }
  return;
}

Assistant:

void particleSamples::perform_weak_resonance_feed_down_Sigma_to_Lambda() {
    if (std::abs(particle_monval) == 3122) {
        // consider Sigma^0 feed down to Lambda
        for (unsigned int iev = 0; iev < resonance_list_Sigma0->size(); iev++) {
            for (unsigned int i = 0; i < (*resonance_list_Sigma0)[iev]->size();
                 i++) {
                particle_info daughter1;
                particle_info daughter2;
                daughter1.mass = 1.116;  // mass of Lambda
                daughter2.mass = 0.0;    // mass of photon
                decayer_ptr->perform_two_body_decay(
                    (*(*resonance_list_Sigma0)[iev])[i], daughter1, daughter2);
                (*particle_list)[iev]->push_back(daughter1);
            }
        }
    }
}